

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O1

bool __thiscall libwebm::VpxPesParser::ParseBcmvHeader(VpxPesParser *this,BcmvHeader *header)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  byte bVar5;
  bool bVar6;
  uint uVar7;
  size_t consumed;
  PacketData bcmv_buffer;
  size_t local_30;
  PacketData local_28;
  
  if ((header == (BcmvHeader *)0x0) || (*(int *)(this + 0x78) != 3)) {
    return false;
  }
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30 = 0;
  bVar6 = RemoveStartCodeEmulationPreventionBytes
                    (this,(uint8_t *)(*(long *)(this + 0x58) + *(long *)(this + 0x70)),
                     *(size_t *)(this + 0x30),&local_28,&local_30);
  if (bVar6) {
    uVar1 = *local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    header->id[0] = uVar1;
    uVar2 = local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[1];
    header->id[1] = uVar2;
    uVar3 = local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[2];
    header->id[2] = uVar3;
    uVar4 = local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[3];
    header->id[3] = uVar4;
    header->length = 0;
    bVar5 = local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[4];
    header->length = (uint)bVar5 << 0x18;
    uVar7 = (uint)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[5] << 0x10 | (uint)bVar5 << 0x18;
    header->length = uVar7;
    uVar7 = (uint)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[6] << 8 | uVar7;
    header->length = uVar7;
    uVar7 = local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[7] | uVar7;
    header->length = uVar7;
    if (((local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[8] == '\0') &&
        (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[9] == '\0')) &&
       ((uVar4 == 'V' && (uVar3 == 'M' && (uVar2 == 'C' && uVar1 == 'B'))) && uVar7 != 0)) {
      *(undefined4 *)(this + 0x78) = 0;
      *(size_t *)(this + 0x70) = *(long *)(this + 0x70) + local_30;
      bVar6 = true;
      goto LAB_0010cc92;
    }
  }
  bVar6 = false;
LAB_0010cc92:
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

bool VpxPesParser::ParseBcmvHeader(BcmvHeader* header) {
  if (!header || parse_state_ != kParseBcmvHeader)
    return false;

  PacketData bcmv_buffer;
  std::size_t consumed = 0;
  if (!RemoveStartCodeEmulationPreventionBytes(&pes_file_data_[read_pos_],
                                               kBcmvHeaderSize, &bcmv_buffer,
                                               &consumed)) {
    return false;
  }

  std::size_t offset = 0;
  header->id[0] = bcmv_buffer[offset++];
  header->id[1] = bcmv_buffer[offset++];
  header->id[2] = bcmv_buffer[offset++];
  header->id[3] = bcmv_buffer[offset++];

  header->length = 0;
  header->length |= bcmv_buffer[offset++] << 24;
  header->length |= bcmv_buffer[offset++] << 16;
  header->length |= bcmv_buffer[offset++] << 8;
  header->length |= bcmv_buffer[offset++];

  // Length stored in the BCMV header is followed by 2 bytes of 0 padding.
  if (bcmv_buffer[offset++] != 0 || bcmv_buffer[offset++] != 0)
    return false;

  if (!header->Valid())
    return false;

  parse_state_ = kFindStartCode;
  read_pos_ += consumed;

  return true;
}